

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_K256_ECDSA.c
# Opt level: O1

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out,uint64_t *scalar,uint64_t *q)

{
  uint uVar1;
  uint64_t uVar2;
  sbyte sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t *t11;
  ulong uVar17;
  uint uVar18;
  uint64_t *t11_1;
  ulong uVar19;
  uint64_t *puVar20;
  uint64_t *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uint64_t *px;
  uint64_t *t11_2;
  ulong uVar28;
  byte bVar29;
  uint64_t tmp0 [15];
  uint64_t table [240];
  uint64_t tmp [15];
  uint64_t local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong local_848;
  uint local_83c;
  uint64_t *local_838;
  uint64_t *local_830;
  uint64_t local_828 [15];
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  ulong local_798;
  ulong local_790;
  ulong local_788;
  ulong local_780;
  ulong local_778;
  ulong local_770;
  ulong local_768;
  ulong local_760;
  ulong local_758;
  ulong local_750;
  ulong local_748;
  ulong local_740;
  ulong local_738;
  ulong local_730;
  ulong local_728;
  ulong local_720;
  ulong local_718;
  ulong local_710;
  ulong local_708;
  ulong local_700;
  ulong local_6f8;
  ulong local_6f0;
  ulong local_6e8;
  ulong local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  ulong local_698;
  ulong local_690;
  ulong local_688;
  ulong local_680;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  ulong local_660;
  ulong local_658;
  ulong local_650;
  ulong local_648;
  ulong local_640;
  ulong local_638;
  ulong local_630;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  ulong local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  ulong local_5c0;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  ulong local_560;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  ulong local_540;
  ulong local_538;
  ulong local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  ulong local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  ulong local_440;
  ulong local_438;
  ulong local_430;
  ulong local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  ulong local_408;
  ulong local_400;
  ulong local_3f8;
  ulong local_3f0;
  ulong local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  ulong local_380;
  ulong local_378;
  ulong local_370;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  ulong local_328;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint64_t local_a8 [15];
  
  bVar29 = 0;
  local_830 = scalar;
  memset(local_828,0,0x780);
  local_a8[0xe] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_828[4] = 0;
  local_828[0] = 0;
  local_828[1] = 0;
  local_828[2] = 0;
  local_828[3] = 0;
  local_828[6] = 0;
  local_828[7] = 0;
  local_828[8] = 0;
  local_828[9] = 0;
  local_828[5] = 1;
  local_828[10] = 0;
  local_828[0xb] = 0;
  local_828[0xc] = 0;
  local_828[0xd] = 0;
  local_828[0xe] = 0;
  puVar20 = q;
  puVar21 = &local_7b0;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_7b0);
  puVar20 = local_a8;
  puVar21 = &local_738;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_738);
  puVar20 = local_a8;
  puVar21 = &local_6c0;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_738);
  puVar20 = local_a8;
  puVar21 = &local_648;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_648);
  puVar20 = local_a8;
  puVar21 = &local_5d0;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_6c0);
  puVar20 = local_a8;
  puVar21 = &local_558;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_558);
  puVar20 = local_a8;
  puVar21 = &local_4e0;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_648);
  puVar20 = local_a8;
  puVar21 = &local_468;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_468);
  puVar20 = local_a8;
  puVar21 = &local_3f0;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_5d0);
  puVar20 = local_a8;
  puVar21 = &local_378;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_378);
  puVar20 = local_a8;
  puVar21 = &local_300;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_558);
  puVar20 = local_a8;
  puVar21 = &local_288;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_288);
  puVar20 = local_a8;
  puVar21 = &local_210;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointDouble_point_double(local_a8,&local_4e0);
  puVar20 = local_a8;
  puVar21 = &local_198;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  Hacl_Impl_K256_PointAdd_point_add(local_a8,q,&local_198);
  puVar20 = local_a8;
  puVar21 = &local_120;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar21 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
    puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
  }
  out[4] = 0;
  out[5] = 0;
  out[8] = 0;
  out[9] = 0;
  out[6] = 0;
  out[7] = 0;
  out[2] = 0;
  out[3] = 0;
  *out = 0;
  out[1] = 0;
  out[5] = 1;
  out[10] = 0;
  out[0xb] = 0;
  out[0xc] = 0;
  out[0xd] = 0;
  out[0xe] = 0;
  local_858 = 0;
  local_868 = 0;
  uStack_860 = 0;
  local_878 = 0;
  uStack_870 = 0;
  local_888 = 0;
  uStack_880 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_8a8 = 0;
  uStack_8a0 = 0;
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8c8 = 0;
  uStack_8c0 = 0;
  uVar18 = 0xfc;
  local_838 = out;
  do {
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    Hacl_Impl_K256_PointDouble_point_double(out,out);
    uVar1 = uVar18 >> 6;
    sVar3 = (sbyte)(uVar18 & 0x3c);
    uVar25 = (uint)(local_830[uVar1] >> sVar3);
    if ((uVar18 & 0x3c) != 0 && uVar1 != 3) {
      uVar25 = uVar25 | (uint)(local_830[(ulong)uVar1 + 1] << (-sVar3 & 0x3fU));
    }
    uVar16 = (ulong)(uVar25 & 0xf);
    puVar20 = local_828;
    puVar21 = &local_8c8;
    local_83c = uVar18;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar21 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar29 * -2 + 1;
      puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
    }
    local_848 = uVar16;
    uVar2 = FStar_UInt64_eq_mask(uVar16,1);
    uVar17 = ~uVar2;
    uVar5 = local_8c8 & uVar17 | local_7b0 & uVar2;
    uVar6 = uStack_8c0 & uVar17 | local_7a8 & uVar2;
    uVar7 = local_8b8 & uVar17 | local_7a0 & uVar2;
    uVar8 = uStack_8b0 & uVar17 | local_798 & uVar2;
    uVar9 = local_8a8 & uVar17 | local_790 & uVar2;
    uVar10 = uStack_8a0 & uVar17 | local_788 & uVar2;
    uVar11 = local_898 & uVar17 | local_780 & uVar2;
    uVar12 = uStack_890 & uVar17 | local_778 & uVar2;
    uVar13 = local_888 & uVar17 | local_770 & uVar2;
    uVar14 = uStack_880 & uVar17 | local_768 & uVar2;
    uVar15 = local_878 & uVar17 | local_760 & uVar2;
    uVar27 = uStack_870 & uVar17 | local_758 & uVar2;
    uVar28 = local_868 & uVar17 | local_750 & uVar2;
    uVar19 = uStack_860 & uVar17 | local_748 & uVar2;
    uVar17 = uVar17 & local_858 | uVar2 & local_740;
    local_8c8 = uVar5;
    uStack_8c0 = uVar6;
    local_8b8 = uVar7;
    uStack_8b0 = uVar8;
    local_8a8 = uVar9;
    uStack_8a0 = uVar10;
    local_898 = uVar11;
    uStack_890 = uVar12;
    local_888 = uVar13;
    uStack_880 = uVar14;
    local_878 = uVar15;
    uStack_870 = uVar27;
    local_868 = uVar28;
    uStack_860 = uVar19;
    local_858 = uVar17;
    uVar2 = FStar_UInt64_eq_mask(uVar16,2);
    uVar26 = ~uVar2;
    uVar16 = uVar5 & uVar26 | local_738 & uVar2;
    uVar5 = uVar6 & uVar26 | local_730 & uVar2;
    uVar6 = uVar7 & uVar26 | local_728 & uVar2;
    uVar7 = uVar8 & uVar26 | local_720 & uVar2;
    uVar8 = uVar9 & uVar26 | local_718 & uVar2;
    uVar9 = uVar10 & uVar26 | local_710 & uVar2;
    uVar24 = uVar11 & uVar26 | local_708 & uVar2;
    uVar23 = uVar12 & uVar26 | local_700 & uVar2;
    uVar22 = uVar13 & uVar26 | local_6f8 & uVar2;
    uVar13 = uVar14 & uVar26 | local_6f0 & uVar2;
    uVar10 = uVar15 & uVar26 | local_6e8 & uVar2;
    uVar27 = uVar27 & uVar26 | local_6e0 & uVar2;
    uVar28 = uVar28 & uVar26 | local_6d8 & uVar2;
    uVar12 = uVar19 & uVar26 | local_6d0 & uVar2;
    uVar19 = uVar26 & uVar17 | uVar2 & local_6c8;
    local_8c8 = uVar16;
    uStack_8c0 = uVar5;
    local_8b8 = uVar6;
    uStack_8b0 = uVar7;
    local_8a8 = uVar8;
    uStack_8a0 = uVar9;
    local_898 = uVar24;
    uStack_890 = uVar23;
    local_888 = uVar22;
    uStack_880 = uVar13;
    local_878 = uVar10;
    uStack_870 = uVar27;
    local_868 = uVar28;
    uStack_860 = uVar12;
    local_858 = uVar19;
    uVar2 = FStar_UInt64_eq_mask(local_848,3);
    uVar11 = ~uVar2;
    uVar26 = uVar16 & uVar11 | local_6c0 & uVar2;
    uVar16 = uVar5 & uVar11 | local_6b8 & uVar2;
    uVar5 = uVar6 & uVar11 | local_6b0 & uVar2;
    uVar6 = uVar7 & uVar11 | local_6a8 & uVar2;
    uVar7 = uVar8 & uVar11 | local_6a0 & uVar2;
    uVar8 = uVar9 & uVar11 | local_698 & uVar2;
    uVar17 = uVar24 & uVar11 | local_690 & uVar2;
    uVar15 = uVar23 & uVar11 | local_688 & uVar2;
    uVar14 = uVar22 & uVar11 | local_680 & uVar2;
    uVar13 = uVar13 & uVar11 | local_678 & uVar2;
    uVar9 = uVar10 & uVar11 | local_670 & uVar2;
    uVar22 = uVar27 & uVar11 | local_668 & uVar2;
    uVar24 = uVar28 & uVar11 | local_660 & uVar2;
    uVar12 = uVar12 & uVar11 | local_658 & uVar2;
    uVar10 = uVar11 & uVar19 | uVar2 & local_650;
    local_8c8 = uVar26;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar13;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar12;
    local_858 = uVar10;
    uVar2 = FStar_UInt64_eq_mask(local_848,4);
    uVar19 = ~uVar2;
    uVar23 = uVar26 & uVar19 | local_648 & uVar2;
    uVar16 = uVar16 & uVar19 | local_640 & uVar2;
    uVar5 = uVar5 & uVar19 | local_638 & uVar2;
    uVar6 = uVar6 & uVar19 | local_630 & uVar2;
    uVar7 = uVar7 & uVar19 | local_628 & uVar2;
    uVar8 = uVar8 & uVar19 | local_620 & uVar2;
    uVar17 = uVar17 & uVar19 | local_618 & uVar2;
    uVar15 = uVar15 & uVar19 | local_610 & uVar2;
    uVar14 = uVar14 & uVar19 | local_608 & uVar2;
    uVar13 = uVar13 & uVar19 | local_600 & uVar2;
    uVar9 = uVar9 & uVar19 | local_5f8 & uVar2;
    uVar22 = uVar22 & uVar19 | local_5f0 & uVar2;
    uVar24 = uVar24 & uVar19 | local_5e8 & uVar2;
    uVar11 = uVar12 & uVar19 | local_5e0 & uVar2;
    uVar19 = uVar19 & uVar10 | uVar2 & local_5d8;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar13;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar19;
    uVar2 = FStar_UInt64_eq_mask(local_848,5);
    uVar10 = ~uVar2;
    uVar23 = uVar23 & uVar10 | local_5d0 & uVar2;
    uVar16 = uVar16 & uVar10 | local_5c8 & uVar2;
    uVar5 = uVar5 & uVar10 | local_5c0 & uVar2;
    uVar6 = uVar6 & uVar10 | local_5b8 & uVar2;
    uVar7 = uVar7 & uVar10 | local_5b0 & uVar2;
    uVar8 = uVar8 & uVar10 | local_5a8 & uVar2;
    uVar17 = uVar17 & uVar10 | local_5a0 & uVar2;
    uVar15 = uVar15 & uVar10 | local_598 & uVar2;
    uVar14 = uVar14 & uVar10 | local_590 & uVar2;
    uVar12 = uVar13 & uVar10 | local_588 & uVar2;
    uVar9 = uVar9 & uVar10 | local_580 & uVar2;
    uVar22 = uVar22 & uVar10 | local_578 & uVar2;
    uVar24 = uVar24 & uVar10 | local_570 & uVar2;
    uVar11 = uVar11 & uVar10 | local_568 & uVar2;
    uVar10 = uVar10 & uVar19 | uVar2 & local_560;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar10;
    uVar2 = FStar_UInt64_eq_mask(local_848,6);
    uVar19 = ~uVar2;
    uVar23 = uVar23 & uVar19 | local_558 & uVar2;
    uVar16 = uVar16 & uVar19 | local_550 & uVar2;
    uVar5 = uVar5 & uVar19 | local_548 & uVar2;
    uVar6 = uVar6 & uVar19 | local_540 & uVar2;
    uVar7 = uVar7 & uVar19 | local_538 & uVar2;
    uVar8 = uVar8 & uVar19 | local_530 & uVar2;
    uVar17 = uVar17 & uVar19 | local_528 & uVar2;
    uVar15 = uVar15 & uVar19 | local_520 & uVar2;
    uVar13 = uVar14 & uVar19 | local_518 & uVar2;
    uVar12 = uVar12 & uVar19 | local_510 & uVar2;
    uVar9 = uVar9 & uVar19 | local_508 & uVar2;
    uVar22 = uVar22 & uVar19 | local_500 & uVar2;
    uVar24 = uVar24 & uVar19 | local_4f8 & uVar2;
    uVar11 = uVar11 & uVar19 | local_4f0 & uVar2;
    uVar19 = uVar19 & uVar10 | uVar2 & local_4e8;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar19;
    uVar2 = FStar_UInt64_eq_mask(local_848,7);
    uVar10 = ~uVar2;
    uVar23 = uVar23 & uVar10 | local_4e0 & uVar2;
    uVar16 = uVar16 & uVar10 | local_4d8 & uVar2;
    uVar5 = uVar5 & uVar10 | local_4d0 & uVar2;
    uVar6 = uVar6 & uVar10 | local_4c8 & uVar2;
    uVar7 = uVar7 & uVar10 | local_4c0 & uVar2;
    uVar8 = uVar8 & uVar10 | local_4b8 & uVar2;
    uVar17 = uVar17 & uVar10 | local_4b0 & uVar2;
    uVar14 = uVar15 & uVar10 | local_4a8 & uVar2;
    uVar13 = uVar13 & uVar10 | local_4a0 & uVar2;
    uVar12 = uVar12 & uVar10 | local_498 & uVar2;
    uVar9 = uVar9 & uVar10 | local_490 & uVar2;
    uVar22 = uVar22 & uVar10 | local_488 & uVar2;
    uVar24 = uVar24 & uVar10 | local_480 & uVar2;
    uVar11 = uVar11 & uVar10 | local_478 & uVar2;
    uVar10 = uVar10 & uVar19 | uVar2 & local_470;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar14;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar10;
    uVar2 = FStar_UInt64_eq_mask(local_848,8);
    uVar19 = ~uVar2;
    uVar23 = uVar23 & uVar19 | local_468 & uVar2;
    uVar16 = uVar16 & uVar19 | local_460 & uVar2;
    uVar5 = uVar5 & uVar19 | local_458 & uVar2;
    uVar6 = uVar6 & uVar19 | local_450 & uVar2;
    uVar7 = uVar7 & uVar19 | local_448 & uVar2;
    uVar8 = uVar8 & uVar19 | local_440 & uVar2;
    uVar15 = uVar17 & uVar19 | local_438 & uVar2;
    uVar14 = uVar14 & uVar19 | local_430 & uVar2;
    uVar13 = uVar13 & uVar19 | local_428 & uVar2;
    uVar12 = uVar12 & uVar19 | local_420 & uVar2;
    uVar9 = uVar9 & uVar19 | local_418 & uVar2;
    uVar22 = uVar22 & uVar19 | local_410 & uVar2;
    uVar24 = uVar24 & uVar19 | local_408 & uVar2;
    uVar11 = uVar11 & uVar19 | local_400 & uVar2;
    uVar17 = uVar19 & uVar10 | uVar2 & local_3f8;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar15;
    uStack_890 = uVar14;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar17;
    uVar2 = FStar_UInt64_eq_mask(local_848,9);
    uVar10 = ~uVar2;
    uVar23 = uVar23 & uVar10 | local_3f0 & uVar2;
    uVar16 = uVar16 & uVar10 | local_3e8 & uVar2;
    uVar5 = uVar5 & uVar10 | local_3e0 & uVar2;
    uVar6 = uVar6 & uVar10 | local_3d8 & uVar2;
    uVar7 = uVar7 & uVar10 | local_3d0 & uVar2;
    uVar8 = uVar8 & uVar10 | local_3c8 & uVar2;
    uVar15 = uVar15 & uVar10 | local_3c0 & uVar2;
    uVar14 = uVar14 & uVar10 | local_3b8 & uVar2;
    uVar13 = uVar13 & uVar10 | local_3b0 & uVar2;
    uVar12 = uVar12 & uVar10 | local_3a8 & uVar2;
    uVar9 = uVar9 & uVar10 | local_3a0 & uVar2;
    uVar19 = uVar22 & uVar10 | local_398 & uVar2;
    uVar24 = uVar24 & uVar10 | local_390 & uVar2;
    uVar11 = uVar11 & uVar10 | local_388 & uVar2;
    uVar10 = uVar10 & uVar17 | uVar2 & local_380;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar15;
    uStack_890 = uVar14;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar19;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar10;
    uVar2 = FStar_UInt64_eq_mask(local_848,10);
    uVar17 = ~uVar2;
    uVar22 = uVar23 & uVar17 | local_378 & uVar2;
    uVar16 = uVar16 & uVar17 | local_370 & uVar2;
    uVar5 = uVar5 & uVar17 | local_368 & uVar2;
    uVar6 = uVar6 & uVar17 | local_360 & uVar2;
    uVar7 = uVar7 & uVar17 | local_358 & uVar2;
    uVar8 = uVar8 & uVar17 | local_350 & uVar2;
    uVar15 = uVar15 & uVar17 | local_348 & uVar2;
    uVar14 = uVar14 & uVar17 | local_340 & uVar2;
    uVar13 = uVar13 & uVar17 | local_338 & uVar2;
    uVar12 = uVar12 & uVar17 | local_330 & uVar2;
    uVar9 = uVar9 & uVar17 | local_328 & uVar2;
    uVar19 = uVar19 & uVar17 | local_320 & uVar2;
    uVar24 = uVar24 & uVar17 | local_318 & uVar2;
    uVar11 = uVar11 & uVar17 | local_310 & uVar2;
    uVar17 = uVar17 & uVar10 | uVar2 & local_308;
    local_8c8 = uVar22;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar15;
    uStack_890 = uVar14;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar19;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar17;
    uVar2 = FStar_UInt64_eq_mask(local_848,0xb);
    uVar10 = ~uVar2;
    uVar23 = uVar22 & uVar10 | local_300 & uVar2;
    uVar16 = uVar16 & uVar10 | local_2f8 & uVar2;
    uVar5 = uVar5 & uVar10 | local_2f0 & uVar2;
    uVar6 = uVar6 & uVar10 | local_2e8 & uVar2;
    uVar7 = uVar7 & uVar10 | local_2e0 & uVar2;
    uVar8 = uVar8 & uVar10 | local_2d8 & uVar2;
    uVar15 = uVar15 & uVar10 | local_2d0 & uVar2;
    uVar14 = uVar14 & uVar10 | local_2c8 & uVar2;
    uVar13 = uVar13 & uVar10 | local_2c0 & uVar2;
    uVar12 = uVar12 & uVar10 | local_2b8 & uVar2;
    uVar9 = uVar9 & uVar10 | local_2b0 & uVar2;
    uVar22 = uVar19 & uVar10 | local_2a8 & uVar2;
    uVar24 = uVar24 & uVar10 | local_2a0 & uVar2;
    uVar11 = uVar11 & uVar10 | local_298 & uVar2;
    uVar10 = uVar10 & uVar17 | uVar2 & local_290;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar15;
    uStack_890 = uVar14;
    local_888 = uVar13;
    uStack_880 = uVar12;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar11;
    local_858 = uVar10;
    uVar2 = FStar_UInt64_eq_mask(local_848,0xc);
    uVar19 = ~uVar2;
    uVar23 = uVar23 & uVar19 | local_288 & uVar2;
    uVar16 = uVar16 & uVar19 | local_280 & uVar2;
    uVar5 = uVar5 & uVar19 | local_278 & uVar2;
    uVar6 = uVar6 & uVar19 | local_270 & uVar2;
    uVar7 = uVar7 & uVar19 | local_268 & uVar2;
    uVar8 = uVar8 & uVar19 | local_260 & uVar2;
    uVar17 = uVar15 & uVar19 | local_258 & uVar2;
    uVar15 = uVar14 & uVar19 | local_250 & uVar2;
    uVar14 = uVar13 & uVar19 | local_248 & uVar2;
    uVar13 = uVar12 & uVar19 | local_240 & uVar2;
    uVar9 = uVar9 & uVar19 | local_238 & uVar2;
    uVar22 = uVar22 & uVar19 | local_230 & uVar2;
    uVar26 = uVar24 & uVar19 | local_228 & uVar2;
    uVar12 = uVar11 & uVar19 | local_220 & uVar2;
    uVar19 = uVar19 & uVar10 | uVar2 & local_218;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar13;
    local_878 = uVar9;
    uStack_870 = uVar22;
    local_868 = uVar26;
    uStack_860 = uVar12;
    local_858 = uVar19;
    uVar2 = FStar_UInt64_eq_mask(local_848,0xd);
    uVar11 = ~uVar2;
    uVar23 = uVar23 & uVar11 | local_210 & uVar2;
    uVar16 = uVar16 & uVar11 | local_208 & uVar2;
    uVar5 = uVar5 & uVar11 | local_200 & uVar2;
    uVar6 = uVar6 & uVar11 | local_1f8 & uVar2;
    uVar7 = uVar7 & uVar11 | local_1f0 & uVar2;
    uVar8 = uVar8 & uVar11 | local_1e8 & uVar2;
    uVar17 = uVar17 & uVar11 | local_1e0 & uVar2;
    uVar15 = uVar15 & uVar11 | local_1d8 & uVar2;
    uVar14 = uVar14 & uVar11 | local_1d0 & uVar2;
    uVar10 = uVar13 & uVar11 | local_1c8 & uVar2;
    uVar24 = uVar9 & uVar11 | local_1c0 & uVar2;
    uVar22 = uVar22 & uVar11 | local_1b8 & uVar2;
    uVar26 = uVar26 & uVar11 | local_1b0 & uVar2;
    uVar13 = uVar12 & uVar11 | local_1a8 & uVar2;
    uVar12 = uVar11 & uVar19 | uVar2 & local_1a0;
    local_8c8 = uVar23;
    uStack_8c0 = uVar16;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar10;
    local_878 = uVar24;
    uStack_870 = uVar22;
    local_868 = uVar26;
    uStack_860 = uVar13;
    local_858 = uVar12;
    uVar2 = FStar_UInt64_eq_mask(local_848,0xe);
    uVar19 = ~uVar2;
    uVar9 = uVar23 & uVar19 | local_198 & uVar2;
    uVar11 = uVar16 & uVar19 | local_190 & uVar2;
    uVar5 = uVar5 & uVar19 | local_188 & uVar2;
    uVar6 = uVar6 & uVar19 | local_180 & uVar2;
    uVar7 = uVar7 & uVar19 | local_178 & uVar2;
    uVar8 = uVar8 & uVar19 | local_170 & uVar2;
    uVar17 = uVar17 & uVar19 | local_168 & uVar2;
    uVar15 = uVar15 & uVar19 | local_160 & uVar2;
    uVar14 = uVar14 & uVar19 | local_158 & uVar2;
    uVar10 = uVar10 & uVar19 | local_150 & uVar2;
    uVar23 = uVar24 & uVar19 | local_148 & uVar2;
    uVar22 = uVar22 & uVar19 | local_140 & uVar2;
    uVar24 = uVar26 & uVar19 | local_138 & uVar2;
    uVar13 = uVar13 & uVar19 | local_130 & uVar2;
    uVar12 = uVar19 & uVar12 | uVar2 & local_128;
    local_8c8 = uVar9;
    uStack_8c0 = uVar11;
    local_8b8 = uVar5;
    uStack_8b0 = uVar6;
    local_8a8 = uVar7;
    uStack_8a0 = uVar8;
    local_898 = uVar17;
    uStack_890 = uVar15;
    local_888 = uVar14;
    uStack_880 = uVar10;
    local_878 = uVar23;
    uStack_870 = uVar22;
    local_868 = uVar24;
    uStack_860 = uVar13;
    local_858 = uVar12;
    uVar2 = FStar_UInt64_eq_mask(local_848,0xf);
    out = local_838;
    uVar16 = ~uVar2;
    local_8c8 = uVar9 & uVar16 | local_120 & uVar2;
    uStack_8c0 = uVar11 & uVar16 | local_118 & uVar2;
    local_8b8 = uVar5 & uVar16 | local_110 & uVar2;
    uStack_8b0 = uVar6 & uVar16 | local_108 & uVar2;
    local_8a8 = uVar7 & uVar16 | local_100 & uVar2;
    uStack_8a0 = uVar8 & uVar16 | local_f8 & uVar2;
    local_898 = uVar17 & uVar16 | local_f0 & uVar2;
    uStack_890 = uVar15 & uVar16 | local_e8 & uVar2;
    local_888 = uVar14 & uVar16 | local_e0 & uVar2;
    uStack_880 = uVar10 & uVar16 | local_d8 & uVar2;
    local_878 = uVar23 & uVar16 | local_d0 & uVar2;
    uStack_870 = uVar22 & uVar16 | local_c8 & uVar2;
    local_868 = uVar24 & uVar16 | local_c0 & uVar2;
    uStack_860 = uVar13 & uVar16 | local_b8 & uVar2;
    local_858 = uVar16 & uVar12 | uVar2 & local_b0;
    Hacl_Impl_K256_PointAdd_point_add(local_838,local_838,&local_8c8);
    uVar18 = local_83c - 4;
  } while (uVar18 != 0xfffffffc);
  return;
}

Assistant:

void Hacl_Impl_K256_PointMul_point_mul(uint64_t *out, uint64_t *scalar, uint64_t *q)
{
  uint64_t table[240U] = { 0U };
  uint64_t tmp[15U] = { 0U };
  uint64_t *t0 = table;
  uint64_t *t1 = table + 15U;
  Hacl_Impl_K256_Point_make_point_at_inf(t0);
  memcpy(t1, q, 15U * sizeof (uint64_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint64_t *t11 = table + (i + 1U) * 15U;
    Hacl_Impl_K256_PointDouble_point_double(tmp, t11);
    memcpy(table + (2U * i + 2U) * 15U, tmp, 15U * sizeof (uint64_t));
    uint64_t *t2 = table + (2U * i + 2U) * 15U;
    Hacl_Impl_K256_PointAdd_point_add(tmp, q, t2);
    memcpy(table + (2U * i + 3U) * 15U, tmp, 15U * sizeof (uint64_t)););
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  uint64_t tmp0[15U] = { 0U };
  for (uint32_t i0 = 0U; i0 < 64U; i0++)
  {
    KRML_MAYBE_FOR4(i, 0U, 4U, 1U, Hacl_Impl_K256_PointDouble_point_double(out, out););
    uint32_t k = 256U - 4U * i0 - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(4U, scalar, k, 4U);
    memcpy(tmp0, (uint64_t *)table, 15U * sizeof (uint64_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i1 + 1U));
      const uint64_t *res_j = table + (i1 + 1U) * 15U;
      KRML_MAYBE_FOR15(i,
        0U,
        15U,
        1U,
        uint64_t *os = tmp0;
        uint64_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp0);
  }
}